

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_getcBlockSize(void *src,size_t srcSize,blockProperties_t *bpPtr)

{
  ushort uVar1;
  uint3 uVar2;
  blockType_e bVar3;
  size_t sVar4;
  
  sVar4 = 0xffffffffffffffb8;
  if (2 < srcSize) {
    uVar1 = *src;
    uVar2 = *src;
    bpPtr->lastBlock = uVar1 & 1;
    bVar3 = uVar1 >> 1 & bt_reserved;
    sVar4 = (size_t)bVar3;
    bpPtr->blockType = bVar3;
    bpPtr->origSize = (uint)(uVar2 >> 3);
    if (bVar3 != bt_rle) {
      if (bVar3 == bt_reserved) {
        return 0xffffffffffffffec;
      }
      sVar4 = (size_t)(uint)(uVar2 >> 3);
    }
  }
  return sVar4;
}

Assistant:

size_t ZSTD_getcBlockSize(const void* src, size_t srcSize,
                          blockProperties_t* bpPtr)
{
    RETURN_ERROR_IF(srcSize < ZSTD_blockHeaderSize, srcSize_wrong, "");

    {   U32 const cBlockHeader = MEM_readLE24(src);
        U32 const cSize = cBlockHeader >> 3;
        bpPtr->lastBlock = cBlockHeader & 1;
        bpPtr->blockType = (blockType_e)((cBlockHeader >> 1) & 3);
        bpPtr->origSize = cSize;   /* only useful for RLE */
        if (bpPtr->blockType == bt_rle) return 1;
        RETURN_ERROR_IF(bpPtr->blockType == bt_reserved, corruption_detected, "");
        return cSize;
    }
}